

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O3

void __thiscall tt::net::Server::Server(Server *this,EventLoop *loop,int threadNum,int port)

{
  int iVar1;
  EventLoopThreadPool *this_00;
  Channel *this_01;
  undefined8 extraout_RAX;
  
  this->loop_ = loop;
  this->threadNum_ = threadNum;
  this_00 = (EventLoopThreadPool *)operator_new(0x48);
  EventLoopThreadPool::EventLoopThreadPool(this_00,loop,threadNum);
  (this->eventLoopThreadPool_)._M_t.
  super___uniq_ptr_impl<tt::net::EventLoopThreadPool,_std::default_delete<tt::net::EventLoopThreadPool>_>
  ._M_t.
  super__Tuple_impl<0UL,_tt::net::EventLoopThreadPool_*,_std::default_delete<tt::net::EventLoopThreadPool>_>
  .super__Head_base<0UL,_tt::net::EventLoopThreadPool_*,_false>._M_head_impl = this_00;
  this->started_ = false;
  this_01 = (Channel *)operator_new(0xa8);
  Channel::Channel(this_01,this->loop_);
  (this->acceptChannel_).super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tt::net::Channel*>
            (&(this->acceptChannel_).
              super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount,this_01);
  this->port_ = port;
  iVar1 = socket_bind_listen(port);
  this->listenFd_ = iVar1;
  Channel::setFd((this->acceptChannel_).
                 super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr,iVar1);
  handle_for_sigpipe();
  iVar1 = setSocketNonBlocking(this->listenFd_);
  if (-1 < iVar1) {
    return;
  }
  net::Server();
  operator_delete(this_01);
  std::unique_ptr<tt::net::EventLoopThreadPool,_std::default_delete<tt::net::EventLoopThreadPool>_>
  ::~unique_ptr(&this->eventLoopThreadPool_);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Server::Server(EventLoop *loop, int threadNum, int port)
    : loop_(loop),
      threadNum_(threadNum),
      eventLoopThreadPool_(new EventLoopThreadPool(loop_, threadNum)),
      started_(false),
      acceptChannel_(new Channel(loop_)),
      port_(port),
      listenFd_(socket_bind_listen(port_)) {
  acceptChannel_->setFd(listenFd_);
  handle_for_sigpipe();
  if(setSocketNonBlocking(listenFd_) < 0) {
//	  std::cout << "listenFd = " << listenFd_ << std::endl;
    perror("set socket non block failed");
    abort();
  }
}